

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void ycc_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  JSAMPLE *pJVar4;
  jpeg_color_deconverter *pjVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  JSAMPROW pJVar16;
  uint local_4c;
  JSAMPARRAY local_48;
  
  if (0 < num_rows) {
    pJVar4 = cinfo->sample_range_limit;
    pjVar5 = cinfo->cconvert;
    p_Var6 = pjVar5[1].start_pass;
    p_Var7 = pjVar5[1].color_convert;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].color_convert;
    uVar3 = cinfo->output_width;
    local_4c = input_row;
    local_48 = output_buf;
    do {
      if ((ulong)uVar3 != 0) {
        uVar14 = (ulong)local_4c;
        pJVar10 = (*input_buf)[uVar14];
        pJVar11 = input_buf[1][uVar14];
        pJVar12 = input_buf[2][uVar14];
        pJVar16 = *local_48;
        uVar14 = 0;
        do {
          uVar15 = (ulong)pJVar10[uVar14];
          bVar1 = pJVar11[uVar14];
          bVar2 = pJVar12[uVar14];
          *pJVar16 = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar15];
          pJVar16[1] = pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                                 *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) +
                              uVar15];
          pJVar16[2] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar15];
          pJVar16 = pJVar16 + 3;
          uVar14 = uVar14 + 1;
        } while (uVar3 != uVar14);
      }
      local_4c = local_4c + 1;
      local_48 = local_48 + 1;
      bVar13 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar13);
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb_convert (j_decompress_ptr cinfo,
		 JSAMPIMAGE input_buf, JDIMENSION input_row,
		 JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int y, cb, cr;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  register int * Crrtab = cconvert->Cr_r_tab;
  register int * Cbbtab = cconvert->Cb_b_tab;
  register INT32 * Crgtab = cconvert->Cr_g_tab;
  register INT32 * Cbgtab = cconvert->Cb_g_tab;
  SHIFT_TEMPS

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      y  = GETJSAMPLE(inptr0[col]);
      cb = GETJSAMPLE(inptr1[col]);
      cr = GETJSAMPLE(inptr2[col]);
      /* Range-limiting is essential due to noise introduced by DCT losses. */
      outptr[RGB_RED] =   range_limit[y + Crrtab[cr]];
      outptr[RGB_GREEN] = range_limit[y +
			      ((int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr],
						 SCALEBITS))];
      outptr[RGB_BLUE] =  range_limit[y + Cbbtab[cb]];
      outptr += RGB_PIXELSIZE;
    }
  }
}